

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImfRle.cpp
# Opt level: O3

int Imf_2_5::rleCompress(int inLength,char *in,char *out)

{
  char cVar1;
  char *pcVar2;
  long lVar3;
  char *pcVar4;
  int iVar5;
  char *runStart;
  char *pcVar6;
  char *pcVar7;
  char *pcVar8;
  long lVar9;
  long lVar10;
  char *pcVar11;
  long lVar12;
  
  iVar5 = (int)out;
  if (inLength < 1) {
LAB_00177135:
    return (int)out - iVar5;
  }
  pcVar4 = in + inLength;
  pcVar6 = in;
LAB_00177017:
  pcVar11 = pcVar6 + ~(ulong)in;
  lVar9 = (long)in - (long)pcVar6;
  pcVar2 = in + 2;
  lVar3 = 0;
  lVar10 = lVar9;
  do {
    lVar12 = lVar3;
    pcVar8 = pcVar2;
    lVar10 = lVar10 + 1;
    pcVar7 = in + lVar12 + 1;
    if (pcVar4 <= pcVar7) {
      lVar9 = lVar9 + lVar12 + 1;
      if (lVar9 < 3) goto LAB_001770eb;
      goto LAB_001770c2;
    }
    if ((long)pcVar11 < -0x7f) break;
    pcVar11 = pcVar11 + -1;
    pcVar2 = pcVar8 + 1;
    lVar3 = lVar12 + 1;
  } while (*pcVar6 == *pcVar7);
  lVar9 = lVar9 + lVar12 + 1;
  if (lVar9 < 3) {
    do {
      if (((pcVar8 < pcVar4) && (cVar1 = pcVar8[-1], cVar1 == *pcVar8)) && (pcVar8 + 1 < pcVar4)) {
        if ((0x7e < lVar10 || cVar1 == pcVar8[1]) || (pcVar4 <= pcVar8)) goto LAB_00177120;
      }
      else if ((0x7e < lVar10) || (pcVar4 <= pcVar8)) {
        pcVar7 = pcVar8 + -1;
        if (lVar10 < 0x7f) {
          pcVar7 = pcVar8;
        }
        goto LAB_001770eb;
      }
      pcVar8 = pcVar8 + 1;
      lVar10 = lVar10 + 1;
    } while( true );
  }
LAB_001770c2:
  *out = (char)lVar9 + -1;
  out[1] = *pcVar6;
  out = out + 2;
  pcVar6 = in + lVar12 + 1;
  in = pcVar6;
  goto LAB_00177112;
LAB_00177120:
  pcVar7 = pcVar8 + -1;
  if (0x7e >= lVar10 && cVar1 != pcVar8[1]) {
    pcVar7 = pcVar8;
  }
LAB_001770eb:
  *out = (char)pcVar6 - (char)pcVar7;
  out = out + 1;
  in = pcVar7;
  if (pcVar6 < pcVar7) {
    lVar10 = (long)pcVar7 - (long)pcVar6;
    do {
      cVar1 = *pcVar6;
      pcVar6 = pcVar6 + 1;
      *out = cVar1;
      out = out + 1;
      lVar10 = lVar10 + -1;
    } while (lVar10 != 0);
  }
LAB_00177112:
  if (pcVar4 <= pcVar6) goto LAB_00177135;
  goto LAB_00177017;
}

Assistant:

int
rleCompress (int inLength, const char in[], signed char out[])
{
    const char *inEnd = in + inLength;
    const char *runStart = in;
    const char *runEnd = in + 1;
    signed char *outWrite = out;

    while (runStart < inEnd)
    {
	while (runEnd < inEnd &&
	       *runStart == *runEnd &&
	       runEnd - runStart - 1 < MAX_RUN_LENGTH)
	{
	    ++runEnd;
	}

	if (runEnd - runStart >= MIN_RUN_LENGTH)
	{
	    //
	    // Compressable run
	    //

	    *outWrite++ = (runEnd - runStart) - 1;
	    *outWrite++ = *(signed char *) runStart;
	    runStart = runEnd;
	}
	else
	{
	    //
	    // Uncompressable run
	    //

	    while (runEnd < inEnd &&
		   ((runEnd + 1 >= inEnd ||
		     *runEnd != *(runEnd + 1)) ||
		    (runEnd + 2 >= inEnd ||
		     *(runEnd + 1) != *(runEnd + 2))) &&
		   runEnd - runStart < MAX_RUN_LENGTH)
	    {
		++runEnd;
	    }

	    *outWrite++ = runStart - runEnd;

	    while (runStart < runEnd)
	    {
		*outWrite++ = *(signed char *) (runStart++);
	    }
	}

	++runEnd;
    }

    return outWrite - out;
}